

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O2

char * uv__strtok(char *str,char *sep,char **itr)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = str;
  if ((str == (char *)0x0) && (str = *itr, pcVar2 = str, str == (char *)0x0)) {
    return (char *)0x0;
  }
  do {
    pcVar3 = sep;
    if (*str == '\0') {
      *itr = (char *)0x0;
      return pcVar2;
    }
    while (cVar1 = *pcVar3, cVar1 != '\0') {
      pcVar3 = pcVar3 + 1;
      if (*str == cVar1) {
        *itr = str + 1;
        *str = '\0';
        return pcVar2;
      }
    }
    str = str + 1;
  } while( true );
}

Assistant:

char* uv__strtok(char* str, const char* sep, char** itr) {
  const char* sep_itr;
  char* tmp;
  char* start;

  if (str == NULL)
    start = tmp = *itr;
  else
    start = tmp = str;

  if (tmp == NULL)
    return NULL;

  while (*tmp != '\0') {
    sep_itr = sep;
    while (*sep_itr != '\0') {
      if (*tmp == *sep_itr) {
        *itr = tmp + 1;
        *tmp = '\0';
        return start;
      }
      sep_itr++;
    }
    tmp++;
  }
  *itr = NULL;
  return start;
}